

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

void NULLC::FinalizeObject(markerType *marker,char *base)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  NULLCRef r;
  NULLCRef local_34;
  
  lVar2 = finalizeList;
  uVar1 = (uint)(*marker >> 8);
  local_34.typeID = uVar1 & 0xffffff;
  if ((*marker & 0x10) == 0) {
    pcVar6 = base + 8;
    local_34.ptr._0_4_ = SUB84(pcVar6,0);
    local_34.ptr._4_4_ = (undefined4)((ulong)pcVar6 >> 0x20);
    uVar7 = (ulong)DAT_0042e88c;
    if (DAT_0042e88c == DAT_0042e888) {
      local_34.ptr = pcVar6;
      FastVector<NULLCRef,_false,_false>::grow_and_add
                ((FastVector<NULLCRef,_false,_false> *)&finalizeList,DAT_0042e88c,&local_34);
    }
    else {
      DAT_0042e88c = DAT_0042e88c + 1;
      *(undefined4 *)(finalizeList + 8 + uVar7 * 0xc) = local_34.ptr._4_4_;
      *(ulong *)(lVar2 + uVar7 * 0xc) = CONCAT44(local_34.ptr._0_4_,uVar1) & 0xffffffff00ffffff;
    }
  }
  else {
    if (*(uint *)(linker + 0x20c) <= local_34.typeID) {
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x7f,
                    "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
                   );
    }
    lVar2 = *(long *)(linker + 0x200);
    uVar4 = local_34.typeID * 0x50;
    uVar1 = *(uint *)(lVar2 + 0x14 + (ulong)uVar4);
    uVar8 = 4;
    if (4 < (byte)uVar1) {
      uVar8 = uVar1;
    }
    pcVar6 = base + (ulong)(uVar8 & 0xff) + 8;
    iVar5 = *(int *)(base + (ulong)(uVar8 & 0xff) + 4);
    if (iVar5 != 0) {
      do {
        lVar3 = finalizeList;
        local_34.ptr._4_4_ = (undefined4)((ulong)pcVar6 >> 0x20);
        local_34.ptr._0_4_ = SUB84(pcVar6,0);
        uVar7 = (ulong)DAT_0042e88c;
        if (DAT_0042e88c == DAT_0042e888) {
          local_34.ptr = pcVar6;
          FastVector<NULLCRef,_false,_false>::grow_and_add
                    ((FastVector<NULLCRef,_false,_false> *)&finalizeList,DAT_0042e88c,&local_34);
          pcVar6 = local_34.ptr;
        }
        else {
          DAT_0042e88c = DAT_0042e88c + 1;
          *(undefined4 *)(finalizeList + 8 + uVar7 * 0xc) = local_34.ptr._4_4_;
          *(ulong *)(lVar3 + uVar7 * 0xc) = CONCAT44(local_34.ptr._0_4_,local_34.typeID);
        }
        pcVar6 = pcVar6 + *(uint *)(lVar2 + (ulong)uVar4 + 4);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
  }
  *(byte *)marker = (byte)*marker | 8;
  return;
}

Assistant:

void FinalizeObject(markerType& marker, char* base)
	{
		if(marker & NULLC::OBJECT_ARRAY)
		{
			ExternTypeInfo &typeInfo = NULLC::linker->exTypes[(unsigned)marker >> 8];

			unsigned arrayPadding = typeInfo.defaultAlign > 4 ? typeInfo.defaultAlign : 4;

			unsigned count = *(unsigned*)(base + sizeof(markerType) + arrayPadding - 4);
			NULLCRef r = { (unsigned)marker >> 8, base + sizeof(markerType) + arrayPadding }; // skip over marker and array size

			for(unsigned i = 0; i < count; i++)
			{
				NULLC::finalizeList.push_back(r);
				r.ptr += typeInfo.size;
			}
		}
		else
		{
			NULLCRef r = { (unsigned)marker >> 8, base + sizeof(markerType) }; // skip over marker
			NULLC::finalizeList.push_back(r);
		}
		marker |= NULLC::OBJECT_FINALIZED;
	}